

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O3

void __thiscall
QStandardItemPrivate::setItemData(QStandardItemPrivate *this,QMap<int,_QVariant> *roles)

{
  QList<QStandardItemData> *this_00;
  const_iterator __last;
  QStandardItem *item;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  long lVar2;
  byte bVar3;
  Data *pDVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  compare_eq_result_container<QList<QStandardItemData>,_QStandardItemData> cVar8;
  int iVar9;
  iterator iVar10;
  iterator iVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_color _Var14;
  ulong uVar15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_color _Var17;
  const_iterator copy;
  QStandardItemData *pQVar18;
  const_iterator __first;
  qsizetype qVar19;
  iterator __i;
  _Base_ptr p_Var20;
  long in_FS_OFFSET;
  bool bVar21;
  QArrayDataPointer<QStandardItemData> local_88;
  _Rb_tree_color local_6c;
  QStandardItemData local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  item = this->q_ptr;
  this_00 = &this->values;
  iVar10 = QList<QStandardItemData>::begin(this_00);
  iVar11 = QList<QStandardItemData>::end(this_00);
  if (iVar10.i != iVar11.i) {
    uVar15 = ((long)iVar11.i - (long)iVar10.i >> 3) * -0x3333333333333333;
    lVar2 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QStandardItemData>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
              (iVar10.i,iVar11.i,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)iVar11.i - (long)iVar10.i < 0x281) {
      std::
      __insertion_sort<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                (iVar10.i,iVar11.i);
    }
    else {
      pQVar18 = iVar10.i + 0x10;
      std::
      __insertion_sort<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                (iVar10.i,pQVar18);
      for (; pQVar18 != iVar11.i; pQVar18 = pQVar18 + 1) {
        std::
        __unguarded_linear_insert<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                  (pQVar18);
      }
    }
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (QStandardItemData *)0x0;
  local_88.size = 0;
  QList<QStandardItemData>::reserve((QList<QStandardItemData> *)&local_88,(this->values).d.size);
  pQVar1 = (roles->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    p_Var12 = (_Base_ptr)0x0;
  }
  else {
    p_Var12 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
    ;
  }
  p_Var20 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    p_Var20 = (_Base_ptr)0x0;
  }
  __first.i = (this->values).d.ptr;
  __last.i = __first.i + (this->values).d.size;
  if (p_Var12 != p_Var20) {
    pQVar18 = __first.i;
LAB_005440d9:
    if (pQVar18 != __last.i) goto code_r0x005440e2;
    do {
      if (3 < *(ulong *)(p_Var12 + 2)) {
        _Var14 = p_Var12[1]._M_color;
        if (_Var14 == 2) {
          _Var14 = _S_red;
        }
        local_68.role = _Var14;
        ::QVariant::QVariant(&local_68.value,(QVariant *)&p_Var12[1]._M_parent);
        QtPrivate::QMovableArrayOps<QStandardItemData>::emplace<QStandardItemData>
                  ((QMovableArrayOps<QStandardItemData> *)&local_88,local_88.size,&local_68);
        QList<QStandardItemData>::end((QList<QStandardItemData> *)&local_88);
        ::QVariant::~QVariant((QVariant *)&local_68.value);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != p_Var20);
    goto LAB_005441f9;
  }
LAB_00544185:
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<QList<QStandardItemData>::const_iterator,std::back_insert_iterator<QList<QStandardItemData>>>
            (__first,__last,(QList<QStandardItemData> *)&local_88);
LAB_005441f9:
  cVar8 = QList<QStandardItemData>::operator==((QList<QStandardItemData> *)&local_88,this_00);
  if (cVar8) goto LAB_00544392;
  pDVar4 = (this->values).d.d;
  pQVar18 = (this->values).d.ptr;
  (this->values).d.d = local_88.d;
  (this->values).d.ptr = local_88.ptr;
  qVar19 = (this->values).d.size;
  (this->values).d.size = local_88.size;
  local_88.d = pDVar4;
  local_88.ptr = pQVar18;
  local_88.size = qVar19;
  if (this->model == (QStandardItemModel *)0x0) goto LAB_00544392;
  local_68._0_8_ = (QArrayData *)0x0;
  local_68.value.d.data.shared = (PrivateShared *)0x0;
  local_68.value.d.data._8_8_ = 0;
  pQVar1 = (roles->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    qVar19 = 1;
  }
  else {
    qVar19 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  QList<int>::reserve((QList<int> *)&local_68,qVar19);
  pQVar1 = (roles->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    p_Var13 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var13 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
    ;
  }
  p_Var16 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    p_Var16 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var13 != p_Var16) {
    bVar7 = 0;
    bVar6 = false;
    do {
      bVar3 = bVar7;
      local_6c = p_Var13[1]._M_color;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_68,local_68.value.d.data._8_8_,(int *)&local_6c);
      QList<int>::end((QList<int> *)&local_68);
      bVar5 = bVar6;
      if (p_Var13[1]._M_color == _S_red) {
        bVar5 = true;
      }
      bVar21 = p_Var13[1]._M_color == 2;
      if (bVar21) {
        bVar5 = bVar6;
      }
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      pQVar1 = (roles->d).d.ptr;
      p_Var16 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var16 = (_Rb_tree_node_base *)0x0;
      }
      bVar7 = bVar3 | bVar21;
      bVar6 = bVar5;
    } while (p_Var13 != p_Var16);
    if ((bool)(bVar3 | bVar21)) {
      if (!bVar5) {
        local_6c = _S_red;
LAB_0054433f:
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&local_68,local_68.value.d.data._8_8_,(int *)&local_6c);
        QList<int>::end((QList<int> *)&local_68);
      }
    }
    else if (bVar5) {
      local_6c = 2;
      goto LAB_0054433f;
    }
  }
  QStandardItemModelPrivate::itemChanged
            (*(QStandardItemModelPrivate **)&this->model->field_0x8,item,(QList<int> *)&local_68);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,4,0x10);
    }
  }
LAB_00544392:
  QArrayDataPointer<QStandardItemData>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
code_r0x005440e2:
  iVar9 = pQVar18->role;
  _Var14 = p_Var12[1]._M_color;
  _Var17 = _Var14;
  if (_Var14 == 2) {
    _Var17 = _S_red;
  }
  if (iVar9 < (int)_Var17) {
    __first.i = pQVar18 + 1;
    QtPrivate::QMovableArrayOps<QStandardItemData>::emplace<QStandardItemData_const&>
              ((QMovableArrayOps<QStandardItemData> *)&local_88,local_88.size,pQVar18);
    QList<QStandardItemData>::end((QList<QStandardItemData> *)&local_88);
  }
  else {
    if (3 < *(ulong *)(p_Var12 + 2)) {
      local_68.role = _Var17;
      ::QVariant::QVariant(&local_68.value,(QVariant *)&p_Var12[1]._M_parent);
      QtPrivate::QMovableArrayOps<QStandardItemData>::emplace<QStandardItemData>
                ((QMovableArrayOps<QStandardItemData> *)&local_88,local_88.size,&local_68);
      QList<QStandardItemData>::end((QList<QStandardItemData> *)&local_88);
      ::QVariant::~QVariant((QVariant *)&local_68.value);
      iVar9 = pQVar18->role;
      _Var14 = p_Var12[1]._M_color;
    }
    if (_Var14 == 2) {
      _Var14 = _S_red;
    }
    __first.i = pQVar18;
    if (iVar9 <= (int)_Var14) {
      __first.i = pQVar18 + 1;
    }
    p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
  }
  pQVar18 = __first.i;
  if (p_Var12 == p_Var20) goto LAB_00544185;
  goto LAB_005440d9;
}

Assistant:

void QStandardItemPrivate::setItemData(const QMap<int, QVariant> &roles)
{
    Q_Q(QStandardItem);

    auto byRole = [](const QStandardItemData& item1, const QStandardItemData& item2) {
        return item1.role < item2.role;
    };

    std::sort(values.begin(), values.end(), byRole);

    /*
        Create a list of QStandardItemData that will contain the original values
        if the matching role is not contained in roles, the new value if it is and
        if the new value is an invalid QVariant, it will be removed.
    */
    QList<QStandardItemData> newValues;
    newValues.reserve(values.size());
    roleMapStandardItemDataUnion(roles.keyValueBegin(),
                                 roles.keyValueEnd(),
                                 values.cbegin(), values.cend(),
                                 std::back_inserter(newValues), ByNormalizedRole());

    if (newValues != values) {
        values.swap(newValues);
        if (model) {
            QList<int> roleKeys;
            roleKeys.reserve(roles.size() + 1);
            bool hasEditRole = false;
            bool hasDisplayRole = false;
            for (auto it = roles.keyBegin(); it != roles.keyEnd(); ++it) {
                roleKeys.push_back(*it);
                if (*it == Qt::EditRole)
                    hasEditRole = true;
                else if (*it == Qt::DisplayRole)
                    hasDisplayRole = true;
            }
            if (hasEditRole && !hasDisplayRole)
                roleKeys.push_back(Qt::DisplayRole);
            else if (!hasEditRole && hasDisplayRole)
                roleKeys.push_back(Qt::EditRole);
            model->d_func()->itemChanged(q, roleKeys);
        }
    }
}